

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O3

void __thiscall CTPNObjProp::gen_code(CTPNObjProp *this,int param_1,int param_2)

{
  CTcPrsNode *pCVar1;
  CTcSymProp *ofs;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  CTcTokenizer *pCVar5;
  CTcGenTarg *this_00;
  int iVar6;
  CTcParser *ds;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcParser *__n;
  CTPNCodeBody *pCVar7;
  char buf [5];
  vm_val_t val;
  char local_35 [5];
  vm_val_t local_30;
  
  ds = (CTcParser *)
       CTcSymObjBase::get_stream_from_meta
                 ((((this->super_CTPNObjPropBase).objdef_)->obj_sym_->super_CTcSymObjBase).
                  metaclass_);
  pCVar5 = G_tok;
  uVar2 = *(undefined4 *)
           ((long)&(this->super_CTPNObjPropBase).super_CTPNStm.super_CTPNStmBase.file_ + 4);
  lVar4 = (this->super_CTPNObjPropBase).super_CTPNStm.super_CTPNStmBase.linenum_;
  uVar3 = *(undefined4 *)
           ((long)&(this->super_CTPNObjPropBase).super_CTPNStm.super_CTPNStmBase.linenum_ + 4);
  *(undefined4 *)&G_tok->last_desc_ =
       *(undefined4 *)&(this->super_CTPNObjPropBase).super_CTPNStm.super_CTPNStmBase.file_;
  *(undefined4 *)((long)&pCVar5->last_desc_ + 4) = uVar2;
  *(int *)&pCVar5->last_linenum_ = (int)lVar4;
  *(undefined4 *)((long)&pCVar5->last_linenum_ + 4) = uVar3;
  __n = G_prs;
  pCVar7 = (this->super_CTPNObjPropBase).code_body_;
  if (pCVar7 == (CTPNCodeBody *)0x0) {
    pCVar1 = (this->super_CTPNObjPropBase).expr_;
    if (pCVar1 == (CTcPrsNode *)0x0) {
      return;
    }
    iVar6 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    this_00 = G_cg;
    if (CONCAT44(extraout_var,iVar6) != 0) {
      ofs = ds->ov_op_sub_;
      iVar6 = (*(((this->super_CTPNObjPropBase).expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase
                [1])();
      CTcGenTarg::write_const_as_dh
                (this_00,(CTcDataStream *)ds,(ulong)ofs,
                 (CTcConstVal *)CONCAT44(extraout_var_00,iVar6));
      return;
    }
    iVar6 = (*(((this->super_CTPNObjPropBase).expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[7])
                      ();
    if (iVar6 == 0) {
      CTcTokenizer::throw_internal_error(0x3aa6);
    }
    pCVar1 = (this->super_CTPNObjPropBase).expr_;
    __n = ds;
    CTcGenTarg::add_const_str
              (G_cg,(char *)pCVar1[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase,
               (size_t)pCVar1[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase,(CTcDataStream *)ds,
               (ulong)((long)&(ds->ov_op_sub_->super_CTcSymPropBase).super_CTcSymbol.
                              super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                              _vptr_CVmHashEntry + 1));
    local_30.typ = VM_DSTRING;
    local_30.val.obj = 0;
  }
  else {
    if (G_prs->constructor_prop_ ==
        (uint)(((this->super_CTPNObjPropBase).prop_sym_)->super_CTcSymPropBase).prop_) {
      pCVar7->field_0xd4 = pCVar7->field_0xd4 | 1;
      pCVar7 = (this->super_CTPNObjPropBase).code_body_;
    }
    if (((this->super_CTPNObjPropBase).field_0x58 & 1) != 0) {
      pCVar7->field_0xd4 = pCVar7->field_0xd4 | 4;
      CTcDataStream::write_obj_id
                (G_static_init_id_stream,
                 (((this->super_CTPNObjPropBase).objdef_)->obj_sym_->super_CTcSymObjBase).obj_id_);
      CTcDataStream::write_prop_id
                (G_static_init_id_stream,
                 (uint)(((this->super_CTPNObjPropBase).prop_sym_)->super_CTcSymPropBase).prop_);
      pCVar7 = (this->super_CTPNObjPropBase).code_body_;
    }
    (**(pCVar7->super_CTPNCodeBodyBase).super_CTPNStmTop.super_CTPNStm.super_CTPNStmBase.
       super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)(pCVar7,0,0);
    local_30.typ = VM_CODEOFS;
    local_30.val.obj = 0;
    CTcAbsFixup::add_abs_fixup
              ((((this->super_CTPNObjPropBase).code_body_)->super_CTPNCodeBodyBase).
               fixup_list_anchor_,(CTcDataStream *)ds,
               (ulong)((long)&(ds->ov_op_sub_->super_CTcSymPropBase).super_CTcSymbol.
                              super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                              _vptr_CVmHashEntry + 1));
  }
  vmb_put_dh(local_35,&local_30);
  CTcDataStream::write((CTcDataStream *)ds,(int)local_35,(void *)0x5,(size_t)__n);
  return;
}

Assistant:

void CTPNObjProp::gen_code(int, int)
{
    vm_val_t val;
    char buf[VMB_DATAHOLDER];

    /* get the correct data stream */
    CTcDataStream *str = objdef_->get_obj_sym()->get_stream();

    /* set the current source location for error reporting */
    G_tok->set_line_info(file_, linenum_);

    /* generate code for our expression or our code body, as appropriate */
    if (code_body_ != 0)
    {
        /* if this is a constructor, mark the code body accordingly */
        if (prop_sym_->get_prop() == G_prs->get_constructor_prop())
            code_body_->set_constructor(TRUE);

        /* if it's static, do some extra work */
        if (is_static_)
        {
            /* mark the code body as static */
            code_body_->set_static();

            /* 
             *   add the obj.prop to the static ID stream, so the VM knows to
             *   invoke this initializer at start-up 
             */
            G_static_init_id_stream
                ->write_obj_id(objdef_->get_obj_sym()->get_obj_id());
            G_static_init_id_stream
                ->write_prop_id(prop_sym_->get_prop());
        }

        /* tell our code body to generate the code */
        code_body_->gen_code(FALSE, FALSE);

        /* 
         *   Set up our code offset value.  Write a code offset of zero for
         *   now, since we won't know the correct offset until link time.  
         */
        val.set_codeofs(0);

        /* 
         *   Add a fixup to the code body's fixup list for our dataholder, so
         *   that we fix up the property value when we link.  Note that the
         *   fixup is one byte into our object stream from the current
         *   offset, because the first byte is the type.  
         */
        CTcAbsFixup::add_abs_fixup(code_body_->get_fixup_list_head(),
                                   str, str->get_ofs() + 1);
        
        /* write out our value in DATAHOLDER format */
        vmb_put_dh(buf, &val);
        str->write(buf, VMB_DATAHOLDER);
    }
    else if (expr_ != 0)
    {
        /* 
         *   if my value is constant, write out a dataholder for the constant
         *   value to the stream; otherwise, write out our code and store a
         *   pointer to the code 
         */
        if (expr_->is_const())
        {
            /* write the constant value to the object stream */
            G_cg->write_const_as_dh(str, str->get_ofs(),
                                    expr_->get_const_val());
        }
        else if (expr_->is_dstring())
        {
            /* it's a double-quoted string node */
            CTPNDstr *dstr = (CTPNDstr *)expr_;

            /* 
             *   Add the string to the constant pool.  Note that the fixup
             *   will be one byte from the current object stream offset,
             *   since we need to write the type byte first.  
             */
            G_cg->add_const_str(dstr->get_str(), dstr->get_str_len(),
                                str, str->get_ofs() + 1);

            /* 
             *   Set up the dstring value.  Use a zero placeholder for now;
             *   add_const_str() already added a fixup for us that will
             *   supply the correct value at link time.  
             */
            val.set_dstring(0);
            vmb_put_dh(buf, &val);
            str->write(buf, VMB_DATAHOLDER);
        }
        else
        {
            /* we should never get here */
            G_tok->throw_internal_error(TCERR_INVAL_PROP_CODE_GEN);
        }
    }
}